

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

ArrayPtr<const_capnp::word> __thiscall
capnp::InputStreamMessageReader::getSegment(InputStreamMessageReader *this,uint id)

{
  ArrayPtr<const_capnp::word> AVar1;
  size_t sVar2;
  word *pwVar3;
  ArrayPtr<const_capnp::word> *this_00;
  word *pwVar4;
  ssize_t sVar5;
  ArrayPtr<const_capnp::word> *local_50;
  byte *allEnd;
  byte *segmentEnd;
  uint id_local;
  InputStreamMessageReader *this_local;
  ArrayPtr<const_capnp::word> segment;
  
  sVar2 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::size(&this->moreSegments);
  if (sVar2 < id) {
    kj::ArrayPtr<const_capnp::word>::ArrayPtr
              ((ArrayPtr<const_capnp::word> *)&this_local,(void *)0x0);
  }
  else {
    if (id == 0) {
      local_50 = &this->segment0;
    }
    else {
      local_50 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator[]
                           (&this->moreSegments,(ulong)(id - 1));
    }
    this_local = (InputStreamMessageReader *)local_50->ptr;
    segment.ptr = (word *)local_50->size_;
    if ((this->readPos != (byte *)0x0) &&
       (pwVar3 = kj::ArrayPtr<const_capnp::word>::end((ArrayPtr<const_capnp::word> *)&this_local),
       (word *)this->readPos < pwVar3)) {
      this_00 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::back(&this->moreSegments);
      pwVar4 = kj::ArrayPtr<const_capnp::word>::end(this_00);
      sVar5 = kj::InputStream::read
                        (this->inputStream,(int)this->readPos,
                         (void *)((long)pwVar3 - (long)this->readPos),
                         (long)pwVar4 - (long)this->readPos);
      this->readPos = this->readPos + sVar5;
    }
  }
  AVar1.size_ = (size_t)segment.ptr;
  AVar1.ptr = (word *)this_local;
  return AVar1;
}

Assistant:

kj::ArrayPtr<const word> InputStreamMessageReader::getSegment(uint id) {
  if (id > moreSegments.size()) {
    return nullptr;
  }

  kj::ArrayPtr<const word> segment = id == 0 ? segment0 : moreSegments[id - 1];

  if (readPos != nullptr) {
    // May need to lazily read more data.
    const byte* segmentEnd = reinterpret_cast<const byte*>(segment.end());
    if (readPos < segmentEnd) {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      readPos += inputStream.read(readPos, segmentEnd - readPos, allEnd - readPos);
    }
  }

  return segment;
}